

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

reference __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
::emplace_back<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>
          (InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
           *this,QueueEntry *args)

{
  ulong uVar1;
  uint64 uVar2;
  ulong uVar3;
  reference pQVar4;
  Rep *pRVar5;
  ulong uVar6;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  uVar3 = uVar1 >> 1;
  uVar6 = 0x10;
  if ((uVar1 & 1) != 0) {
    uVar6 = *(ulong *)&this->rep_;
  }
  pRVar5 = &this->rep_;
  if (uVar6 < uVar3) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>]"
                 );
  }
  if (uVar3 == uVar6) {
    pQVar4 = GrowAndEmplaceBack<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>(this,args);
    return pQVar4;
  }
  if (uVar3 < uVar6) {
    (this->allocator_and_tag_).tag_.size_ = uVar1 + 2;
    if ((uVar1 & 1) != 0) {
      pRVar5 = *(Rep **)((long)&this->rep_ + 8);
    }
    pQVar4 = (reference)((long)pRVar5 + uVar3 * 0x18);
    pQVar4->index_cell = args->index_cell;
    uVar2 = (args->id).id_;
    (pQVar4->distance).distance_.length2_ = (args->distance).distance_.length2_;
    (pQVar4->id).id_ = uVar2;
    return pQVar4;
  }
  __assert_fail("s < capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x21b,
                "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>]"
               );
}

Assistant:

reference emplace_back(Args&&... args) {
    size_type s = size();
    assert(s <= capacity());
    if (ABSL_PREDICT_FALSE(s == capacity())) {
      return GrowAndEmplaceBack(std::forward<Args>(args)...);
    }
    assert(s < capacity());

    pointer space;
    if (allocated()) {
      tag().set_allocated_size(s + 1);
      space = allocated_space();
    } else {
      tag().set_inline_size(s + 1);
      space = inlined_space();
    }
    return Construct(space + s, std::forward<Args>(args)...);
  }